

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall spirv_cross::SPIREntryPoint::~SPIREntryPoint(SPIREntryPoint *this)

{
  SPIREntryPoint *this_local;
  
  Bitset::~Bitset(&this->flags);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::~SmallVector
            (&this->interface_variables);
  ::std::__cxx11::string::~string((string *)&this->orig_name);
  ::std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

SPIREntryPoint(FunctionID self_, spv::ExecutionModel execution_model, const std::string &entry_name)
	    : self(self_)
	    , name(entry_name)
	    , orig_name(entry_name)
	    , model(execution_model)
	{
	}